

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

void usage(void)

{
  printf("Usage: iconify [-h] [-f [-a] [-n]]\n");
  printf("Options:\n");
  printf("  -a create windows for all monitors\n");
  printf("  -f create full screen window(s)\n");
  printf("  -h show this help\n");
  printf("  -n no automatic iconification of full screen windows\n");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: iconify [-h] [-f [-a] [-n]]\n");
    printf("Options:\n");
    printf("  -a create windows for all monitors\n");
    printf("  -f create full screen window(s)\n");
    printf("  -h show this help\n");
    printf("  -n no automatic iconification of full screen windows\n");
}